

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_bool(uchar **p,uchar *start,int boolean)

{
  uchar *puVar1;
  uchar uVar2;
  size_t len;
  int boolean_local;
  uchar *start_local;
  uchar **p_local;
  
  if ((long)*p - (long)start < 1) {
    p_local._4_4_ = -0x6c;
  }
  else {
    uVar2 = '\0';
    if (boolean != 0) {
      uVar2 = 0xff;
    }
    puVar1 = *p;
    *p = puVar1 + -1;
    puVar1[-1] = uVar2;
    p_local._4_4_ = mbedtls_asn1_write_len_and_tag(p,start,1,'\x01');
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_bool(unsigned char **p, const unsigned char *start, int boolean)
{
    size_t len = 0;

    if (*p - start < 1) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    *--(*p) = (boolean) ? 255 : 0;
    len++;

    return mbedtls_asn1_write_len_and_tag(p, start, len, MBEDTLS_ASN1_BOOLEAN);
}